

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii_art.c
# Opt level: O0

cf_int_t cfx_art_print(cf_char_t *input,cf_char_t *buff,cf_size_t size,cfx_art_font_t font)

{
  cf_size_t cVar1;
  cf_void_t *addr;
  cf_size_t len;
  cf_size_t cnt;
  cf_size_t j;
  cf_size_t i;
  cf_char_t **pp;
  cfx_art_font_t font_local;
  cf_size_t size_local;
  cf_char_t *buff_local;
  cf_char_t *input_local;
  
  len = 0;
  if ((input == (cf_char_t *)0x0) || (buff == (cf_char_t *)0x0)) {
    input_local._4_4_ = -1;
  }
  else {
    cVar1 = cf_strlen(input);
    if (cVar1 == 0) {
      input_local._4_4_ = 0;
    }
    else {
      addr = cf_malloc_dbg(cVar1 << 3,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                           ,"cfx_art_print",0xe3);
      j = 0;
      for (buff_local = input; *buff_local != '\0'; buff_local = buff_local + 1) {
        if (*buff_local == ' ') {
          *(cf_char_t **)((long)addr + j * 8) = art_space;
        }
        else if (*buff_local == '\t') {
          *(cf_char_t **)((long)addr + j * 8) = art_tab;
        }
        else {
          if ((*buff_local < '!') || ('\x7f' < *buff_local)) {
LAB_0010453f:
            cf_free_dbg(addr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                        ,"cfx_art_print",0x112);
            *buff = '\0';
            return -1;
          }
          if (font == CFX_ART_FONT_SLANT) {
            *(cf_char_t **)((long)addr + j * 8) = ascii_map_slant[*buff_local + -0x21];
          }
          else {
            *(cf_char_t **)((long)addr + j * 8) = ascii_map[*buff_local + -0x21];
          }
        }
        j = j + 1;
      }
      for (j = 0; j < 6; j = j + 1) {
        for (cnt = 0; cnt < cVar1; cnt = cnt + 1) {
          while (**(char **)((long)addr + cnt * 8) != '\n') {
            if (size < len) goto LAB_0010453f;
            buff[len] = **(cf_char_t **)((long)addr + cnt * 8);
            *(long *)((long)addr + cnt * 8) = *(long *)((long)addr + cnt * 8) + 1;
            len = len + 1;
          }
          *(long *)((long)addr + cnt * 8) = *(long *)((long)addr + cnt * 8) + 1;
        }
        buff[len] = '\n';
        len = len + 1;
      }
      cf_free_dbg(addr,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                  ,"cfx_art_print",0x10d);
      buff[len] = '\0';
      input_local._4_4_ = (cf_int_t)len;
    }
  }
  return input_local._4_4_;
}

Assistant:

cf_int_t cfx_art_print(const cf_char_t* input, cf_char_t* buff, cf_size_t size, cfx_art_font_t font) {
    const cf_char_t** pp = CF_NULL_PTR;
    cf_size_t i = 0, j = 0, cnt = 0, len;
    if (input == CF_NULL_PTR || buff == CF_NULL_PTR) return -1;

    len = cf_strlen(input);
    if (len == 0) return 0;

    pp = cf_malloc_z(sizeof(cf_char_t*) * len);

    /* initialize the map pointer */
    i = 0;
    while (*input) {
        if (*input == ' ') {
            pp[i] = art_space;
        } else if (*input == '\t') {
            pp[i] = art_tab;
        } else if (*input < CFX_ART_MAP_BEGIN || *input > CFX_ART_MAP_END) {
            goto CFX_ART_FAIL;
        } else {
            switch (font) {
                case CFX_ART_FONT_SLANT:
                    pp[i] = ascii_map_slant[*input - CFX_ART_MAP_BEGIN];
                    break;
                default:
                    pp[i] = ascii_map[*input - CFX_ART_MAP_BEGIN];
                    break;
            }
        }
        input++;
        i++;
    }

    /* for each line */
    i = 0;
    while (i < CFX_ART_MAX_LINES) {
        /* write one by one */
        j = 0;
        while (j < len) {
            while (*pp[j] != '\n') {
                if (cnt > size) goto CFX_ART_FAIL;
                buff[cnt++] = *pp[j];
                pp[j]++;
            }
            pp[j]++;
            j++;
        }
        buff[cnt++] = '\n';
        i++;
    }
    cf_free(pp);
    buff[cnt] = '\0';
    return cnt;

CFX_ART_FAIL:
    cf_free(pp);
    buff[0] = '\0';
    return -1;
}